

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

int __thiscall dh::analysis::numberInteger(analysis *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TYPE TVar2;
  int iVar3;
  ostream *poVar4;
  int ret;
  stringstream ss;
  int local_1c4;
  token local_1c0;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  TVar2 = token::getType((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 == NUMINT) {
    std::__cxx11::stringstream::stringstream(local_198);
    token::getVal_abi_cxx11_
              (&local_1c0._val,
               (this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,local_1c0._val._M_dataplus._M_p,local_1c0._val._M_string_length);
    paVar1 = &local_1c0._val.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._val._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._val._M_dataplus._M_p);
    }
    std::istream::operator>>((istream *)local_198,&local_1c4);
    scanner::getToken(&local_1c0,&this->_tokens);
    token::operator=((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._val._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._val._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_198);
    std::ios_base::~ios_base(local_118);
    return local_1c4;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[ERROR] Incompitable type: \"");
  TVar2 = token::getType((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,TVar2);
  poVar4 = std::operator<<(poVar4,"\" in line ");
  iVar3 = token::getLineno((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4," expect int type\n");
  exit(1);
}

Assistant:

int analysis::numberInteger()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in numberInteger\n";
#endif

	if ( tmp->getType() == TYPE::NUMINT)
	{
		::std::stringstream ss;
		ss << tmp->getVal();

		int ret;
		ss >> ret;
		*tmp = _tokens.getToken();

		return ret;
	} else 
	{
		::std::cerr << "[ERROR] Incompitable type: \""
			<< tmp->getType()
			<< "\" in line "
			<< tmp->getLineno()
			<< " expect int type\n";
		::std::exit(1);
	}
}